

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Winding winding,
          bool usePointMode)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream str;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"winding mode ");
  pcVar2 = (char *)0x0;
  if ((int)this == 1) {
    pcVar2 = "cw";
  }
  pcVar3 = "ccw";
  if ((int)this != 0) {
    pcVar3 = pcVar2;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,", ");
  pcVar2 = "don\'t ";
  if ((char)winding != '\0') {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"use point mode");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getProgramDescription (const Winding winding, const bool usePointMode)
{
	std::ostringstream str;
	str << "winding mode " << getWindingShaderName(winding) << ", " << (usePointMode ? "" : "don't ") << "use point mode";
	return str.str();
}